

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O0

int BN_mod_exp_mont_word(BIGNUM *r,ulong a,BIGNUM *p,BIGNUM *m,BN_CTX *ctx,BN_MONT_CTX *m_ctx)

{
  bool bVar1;
  int iVar2;
  BIGNUM *pBVar3;
  pointer a_00;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_48;
  UniquePtr<BIGNUM> a_bignum;
  BN_MONT_CTX *mont_local;
  BN_CTX *ctx_local;
  BIGNUM *m_local;
  BIGNUM *p_local;
  BN_ULONG a_local;
  BIGNUM *rr_local;
  
  a_bignum._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)m_ctx;
  iVar2 = bn_minimal_width((BIGNUM *)m);
  p_local = (BIGNUM *)a;
  if (iVar2 == 1) {
    p_local = (BIGNUM *)(a % *m->d);
  }
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_48,(pointer)pBVar3);
  bVar1 = std::operator==(&local_48,(nullptr_t)0x0);
  if (!bVar1) {
    pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_48);
    iVar2 = BN_set_word(pBVar3,(ulong)p_local);
    if (iVar2 != 0) {
      a_00 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_48);
      rr_local._4_4_ =
           BN_mod_exp_mont((BIGNUM *)r,a_00,(BIGNUM *)p,(BIGNUM *)m,(BN_CTX *)ctx,
                           (BN_MONT_CTX *)
                           a_bignum._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
      goto LAB_002f1736;
    }
  }
  ERR_put_error(3,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/exponentiation.cc"
                ,0x85);
  rr_local._4_4_ = 0;
LAB_002f1736:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_48);
  return rr_local._4_4_;
}

Assistant:

int BN_mod_exp_mont_word(BIGNUM *rr, BN_ULONG a, const BIGNUM *p,
                         const BIGNUM *m, BN_CTX *ctx,
                         const BN_MONT_CTX *mont) {
  // BN_mod_exp_mont requires reduced inputs.
  if (bn_minimal_width(m) == 1) {
    a %= m->d[0];
  }

  bssl::UniquePtr<BIGNUM> a_bignum(BN_new());
  if (a_bignum == nullptr || !BN_set_word(a_bignum.get(), a)) {
    OPENSSL_PUT_ERROR(BN, ERR_R_INTERNAL_ERROR);
    return 0;
  }

  return BN_mod_exp_mont(rr, a_bignum.get(), p, m, ctx, mont);
}